

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void wipe_monster_lore(monster_race *race,monster_lore_conflict *lore)

{
  monster_friends *pmVar1;
  monster_friends_base *pmVar2;
  monster_mimic *pmVar3;
  monster_drop *pmVar4;
  monster_blow *__s;
  _Bool *__s_00;
  monster_mimic *mkn;
  monster_friends_base *fbn;
  monster_friends *fn;
  monster_drop *dn;
  monster_mimic *mk;
  monster_friends_base *fb;
  monster_friends *f;
  monster_drop *d;
  _Bool *blow_known;
  monster_blow *blows;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  
  if (race == (monster_race *)0x0) {
    __assert_fail("race",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                  ,0x17f,
                  "void wipe_monster_lore(const struct monster_race *, struct monster_lore *)");
  }
  if (lore != (monster_lore_conflict *)0x0) {
    f = (monster_friends *)lore->drops;
    while (f != (monster_friends *)0x0) {
      pmVar1 = f->next;
      mem_free(f);
      f = pmVar1;
    }
    fb = (monster_friends_base *)lore->friends;
    while (fb != (monster_friends_base *)0x0) {
      pmVar2 = fb->next;
      mem_free(fb);
      fb = pmVar2;
    }
    mk = (monster_mimic *)lore->friends_base;
    while (mk != (monster_mimic *)0x0) {
      pmVar3 = mk->next;
      mem_free(mk);
      mk = pmVar3;
    }
    dn = (monster_drop *)lore->mimic_kinds;
    while (dn != (monster_drop *)0x0) {
      pmVar4 = dn->next;
      mem_free(dn);
      dn = pmVar4;
    }
    __s = lore->blows;
    memset(__s,0,(ulong)z_info->mon_blows_max * 0x30);
    __s_00 = lore->blow_known;
    memset(__s_00,0,(ulong)z_info->mon_blows_max);
    memset(lore,0,0x70);
    lore->blows = __s;
    lore->blow_known = __s_00;
    return;
  }
  __assert_fail("lore",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                ,0x180,"void wipe_monster_lore(const struct monster_race *, struct monster_lore *)")
  ;
}

Assistant:

void wipe_monster_lore(const struct monster_race *race, struct monster_lore *lore)
{
	struct monster_blow *blows;
	bool *blow_known;
	struct monster_drop *d;
	struct monster_friends *f;
	struct monster_friends_base *fb;
	struct monster_mimic *mk;

	assert(race);
	assert(lore);

	d = lore->drops;
	while (d) {
		struct monster_drop *dn = d->next;
		mem_free(d);
		d = dn;
	}
	f = lore->friends;
	while (f) {
		struct monster_friends *fn = f->next;
		mem_free(f);
		f = fn;
	}
	fb = lore->friends_base;
	while (fb) {
		struct monster_friends_base *fbn = fb->next;
		mem_free(fb);
		fb = fbn;
	}
	mk = lore->mimic_kinds;
	while (mk) {
		struct monster_mimic *mkn = mk->next;
		mem_free(mk);
		mk = mkn;
	}
	/*
	 * Keep the blows and blow_known pointers - other code assumes they
	 * are not NULL.  Wipe the pointed to memory.
	 */
	blows = lore->blows;
	memset(blows, 0, z_info->mon_blows_max * sizeof(*blows));
	blow_known = lore->blow_known;
	memset(blow_known, 0, z_info->mon_blows_max * sizeof(*blow_known));
	memset(lore, 0, sizeof(*lore));
	lore->blows = blows;
	lore->blow_known = blow_known;
}